

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

bool __thiscall QPDF::checkLinearizationInternal(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  pointer pQVar2;
  bool bVar3;
  QPDF *pQVar4;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar5;
  uint uVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  mapped_type *this_00;
  long *plVar10;
  QPDFObjGen *pQVar11;
  undefined8 *puVar12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  const_iterator cVar15;
  mapped_type *pmVar16;
  logic_error *this_01;
  ulong *puVar17;
  QPDFObjGen QVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  char cVar22;
  ulong uVar23;
  QPDFObjectHandle *pQVar24;
  QPDF *pQVar25;
  _Base_ptr p_Var26;
  type ii;
  uint uVar27;
  ulong uVar28;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  string_view msg_04;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> shared_idx_to_obj;
  string __str;
  string __str_2;
  QPDFObjGen og;
  string __str_4;
  string __str_5;
  string __str_3;
  undefined1 local_188 [8];
  undefined1 local_180 [24];
  QPDFObjGen local_168;
  size_t local_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  QPDF *local_138;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  long lStack_f8;
  QPDFObjGen local_f0;
  QPDFObjGen local_e8;
  ulong local_e0;
  QPDFObjGen QStack_d8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  Members *local_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  QPDFObjectHandle *local_80;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_d0 = getAllPages(this);
  pQVar24 = (local_d0->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((local_d0->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish == pQVar24) {
    uVar23 = 0;
    uVar28 = 0;
  }
  else {
    iVar9 = *(int *)((long)&(_Var1._M_head_impl)->linp + 8);
    iVar8 = QPDFObjectHandle::getObjectID(pQVar24);
    if (iVar9 != iVar8) {
      msg._M_str = "first page object (/O) mismatch";
      msg._M_len = 0x1f;
      linearizationWarning(this,msg);
    }
    uVar21 = (long)(local_d0->
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_d0->
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    uVar28 = (long)uVar21 >> 4;
    if ((uVar28 & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar28);
    }
    iVar9 = (int)uVar28;
    local_a8 = _Var1._M_head_impl;
    if (*(int *)((long)&(_Var1._M_head_impl)->linp + 0x18) != iVar9) {
      msg_00._M_str = "page count (/N) mismatch";
      msg_00._M_len = 0x18;
      linearizationWarning(this,msg_00);
    }
    pvVar5 = local_d0;
    uVar23 = 0;
    local_138 = this;
    while( true ) {
      if (iVar9 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar9);
      }
      pQVar25 = local_138;
      if (uVar23 == (long)(int)(uVar21 >> 4)) {
        plVar10 = *(long **)&(((local_138->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                             super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar10 + 0x28))(plVar10,(local_a8->linp).xref_zero_offset,0);
        goto LAB_00214822;
      }
      pQVar2 = (pvVar5->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar28 = (long)(pvVar5->
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pQVar2 >> 4;
      if (uVar28 <= uVar23) break;
      local_f0 = QPDFObjectHandle::getObjGen(pQVar2 + uVar23);
      this_00 = std::
                map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                ::operator[](&((local_138->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                              xref_table,&local_f0);
      iVar8 = QPDFXRefEntry::getType(this_00);
      if (iVar8 == 2) {
        cVar22 = '\x01';
        if (9 < uVar23) {
          uVar28 = uVar23;
          cVar7 = '\x04';
          do {
            cVar22 = cVar7;
            if (uVar28 < 100) {
              cVar22 = cVar22 + -2;
              goto LAB_002146a6;
            }
            if (uVar28 < 1000) {
              cVar22 = cVar22 + -1;
              goto LAB_002146a6;
            }
            if (uVar28 < 10000) goto LAB_002146a6;
            bVar3 = 99999 < uVar28;
            uVar28 = uVar28 / 10000;
            cVar7 = cVar22 + '\x04';
          } while (bVar3);
          cVar22 = cVar22 + '\x01';
        }
LAB_002146a6:
        local_130 = &local_120;
        std::__cxx11::string::_M_construct((ulong)&local_130,cVar22);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_130,(uint)local_128,uVar23);
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x28041f);
        local_158 = &local_148;
        puVar17 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar17) {
          local_148 = *puVar17;
          lStack_140 = plVar10[3];
        }
        else {
          local_148 = *puVar17;
          local_158 = (ulong *)*plVar10;
        }
        local_150 = plVar10[1];
        *plVar10 = (long)puVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        pQVar11 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_158);
        local_188 = (undefined1  [8])((long)local_180 + 8);
        QVar18 = (QPDFObjGen)(pQVar11 + 2);
        if (*pQVar11 == QVar18) {
          local_180._8_8_ = *(undefined8 *)QVar18;
          local_180._16_8_ = pQVar11[3];
        }
        else {
          local_180._8_8_ = *(undefined8 *)QVar18;
          local_188 = (undefined1  [8])*pQVar11;
        }
        local_180._0_8_ = pQVar11[1];
        *pQVar11 = QVar18;
        pQVar11[1].obj = 0;
        pQVar11[1].gen = 0;
        *(undefined1 *)&pQVar11[2].obj = 0;
        msg_01._M_str = (char *)local_188;
        msg_01._M_len._0_4_ = (int)local_180._0_8_;
        msg_01._M_len._4_4_ = SUB84(local_180._0_8_,4);
        linearizationWarning(local_138,msg_01);
        if (local_188 != (undefined1  [8])((long)local_180 + 8)) {
          operator_delete((void *)local_188,(ulong)(local_180._8_8_ + 1));
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
      }
      uVar23 = uVar23 + 1;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar23,
             uVar28);
  while ((0x100002400U >> ((ulong)local_188 & 0x3f) & 1) != 0) {
LAB_00214822:
    plVar10 = *(long **)&(((pQVar25->m)._M_t.
                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                           .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar10 + 0x38))(plVar10,local_188,1);
    if (0x20 < ((ulong)local_188 & 0xff)) break;
  }
  plVar10 = *(long **)&(((pQVar25->m)._M_t.
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  uVar27 = 1;
  (**(code **)(*plVar10 + 0x28))(plVar10,0xffffffffffffffff,1);
  uVar23 = (**(code **)(**(long **)&(((pQVar25->m)._M_t.
                                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                    file).
                                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                       0x20))();
  uVar28 = ((pQVar25->m)._M_t.
            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
            super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->first_xref_item_offset;
  if (uVar23 != uVar28) {
    uVar23 = -uVar28;
    if (0 < (long)uVar28) {
      uVar23 = uVar28;
    }
    if (9 < uVar23) {
      uVar21 = uVar23;
      uVar6 = 4;
      do {
        uVar27 = uVar6;
        if (uVar21 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_002148f3;
        }
        if (uVar21 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_002148f3;
        }
        if (uVar21 < 10000) goto LAB_002148f3;
        bVar3 = 99999 < uVar21;
        uVar21 = uVar21 / 10000;
        uVar6 = uVar27 + 4;
      } while (bVar3);
      uVar27 = uVar27 + 1;
    }
LAB_002148f3:
    local_f0 = (QPDFObjGen)&local_e0;
    std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar27 - (char)((long)uVar28 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              ((char *)((long)local_f0 - ((long)uVar28 >> 0x3f)),uVar27,uVar23);
    puVar12 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x280448);
    local_130 = &local_120;
    plVar10 = puVar12 + 2;
    if ((long *)*puVar12 == plVar10) {
      local_120 = *plVar10;
      uStack_118 = puVar12[3];
    }
    else {
      local_120 = *plVar10;
      local_130 = (long *)*puVar12;
    }
    local_128 = puVar12[1];
    *puVar12 = plVar10;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
    puVar17 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar17) {
      local_148 = *puVar17;
      lStack_140 = plVar10[3];
      local_158 = &local_148;
    }
    else {
      local_148 = *puVar17;
      local_158 = (ulong *)*plVar10;
    }
    local_150 = plVar10[1];
    *plVar10 = (long)puVar17;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    uVar23 = (**(code **)(**(long **)&(((pQVar25->m)._M_t.
                                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->file).
                                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                         0x20))();
    uVar28 = -uVar23;
    if (0 < (long)uVar23) {
      uVar28 = uVar23;
    }
    uVar27 = 1;
    if (9 < uVar28) {
      uVar21 = uVar28;
      uVar6 = 4;
      do {
        uVar27 = uVar6;
        if (uVar21 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_00214a60;
        }
        if (uVar21 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_00214a60;
        }
        if (uVar21 < 10000) goto LAB_00214a60;
        bVar3 = 99999 < uVar21;
        uVar21 = uVar21 / 10000;
        uVar6 = uVar27 + 4;
      } while (bVar3);
      uVar27 = uVar27 + 1;
    }
LAB_00214a60:
    local_110 = &local_100;
    std::__cxx11::string::_M_construct
              ((ulong)&local_110,(char)uVar27 - (char)((long)uVar23 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              ((char *)((long)local_110 - ((long)uVar23 >> 0x3f)),uVar27,uVar28);
    uVar28 = 0xf;
    if (local_158 != &local_148) {
      uVar28 = local_148;
    }
    if (uVar28 < (ulong)(local_108 + local_150)) {
      uVar28 = 0xf;
      if (local_110 != &local_100) {
        uVar28 = local_100;
      }
      if (uVar28 < (ulong)(local_108 + local_150)) goto LAB_00214ae8;
      pQVar11 = (QPDFObjGen *)
                std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_158);
    }
    else {
LAB_00214ae8:
      pQVar11 = (QPDFObjGen *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_110);
    }
    QVar18 = (QPDFObjGen)(pQVar11 + 2);
    if (*pQVar11 == QVar18) {
      local_180._8_8_ = *(undefined8 *)QVar18;
      local_180._16_8_ = pQVar11[3];
      local_188 = (undefined1  [8])((long)local_180 + 8);
    }
    else {
      local_180._8_8_ = *(undefined8 *)QVar18;
      local_188 = (undefined1  [8])*pQVar11;
    }
    local_180._0_8_ = pQVar11[1];
    *pQVar11 = QVar18;
    pQVar11[1].obj = 0;
    pQVar11[1].gen = 0;
    *(undefined1 *)QVar18 = 0;
    msg_02._M_str = (char *)local_188;
    msg_02._M_len._0_4_ = (int)local_180._0_8_;
    msg_02._M_len._4_4_ = SUB84(local_180._0_8_,4);
    linearizationWarning(local_138,msg_02);
    if (local_188 != (undefined1  [8])((long)local_180 + 8)) {
      operator_delete((void *)local_188,(ulong)(local_180._8_8_ + 1));
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    pQVar25 = local_138;
    if (local_158 != &local_148) {
      operator_delete(local_158,local_148 + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_f0 != (QPDFObjGen)&local_e0) {
      operator_delete((void *)local_f0,local_e0 + 1);
    }
  }
  if (((pQVar25->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
       _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->uncompressed_after_compressed ==
      true) {
    msg_03._M_str =
         "linearized file contains an uncompressed object after a compressed one in a cross-reference stream"
    ;
    msg_03._M_len = 0x62;
    linearizationWarning(pQVar25,msg_03);
  }
  local_180._16_8_ = local_180;
  local_180._0_8_ = local_180._0_8_ & 0xffffffff00000000;
  local_180._8_8_ = (_Base_ptr)0x0;
  local_160 = 0;
  _Var1._M_head_impl =
       (pQVar25->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
       _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  p_Var14 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->xref_table + 0x18);
  p_Var26 = (_Base_ptr)((long)&(_Var1._M_head_impl)->xref_table + 8);
  local_168 = (QPDFObjGen)local_180._16_8_;
  if (p_Var14 != p_Var26) {
    do {
      iVar9 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var14[1]._M_parent);
      if (iVar9 == 2) {
        iVar9 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)&p_Var14[1]._M_parent);
        local_158 = (ulong *)CONCAT44(local_158._4_4_,p_Var14[1]._M_color);
        pmVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)local_188,(key_type *)&local_158);
        *pmVar13 = iVar9;
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var26);
  }
  pQVar25 = local_138;
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  optimize_internal<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            (local_138,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)local_188
             ,false,(function<int_(QPDFObjectHandle_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  calculateLinearizationData<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            (pQVar25,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     local_188);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_188);
  _Var1._M_head_impl =
       (pQVar25->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
       _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(pointer *)
       &((_Var1._M_head_impl)->part6).
        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> ==
      *(pointer *)((long)&(_Var1._M_head_impl)->part6 + 8)) {
    local_188 = (undefined1  [8])((long)local_180 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_188,"linearization part 6 unexpectedly empty","");
    stopOnError(pQVar25,(string *)local_188);
    if (local_188 != (undefined1  [8])((long)local_180 + 8)) {
      operator_delete((void *)local_188,(ulong)(local_180._8_8_ + 1));
    }
  }
  pQVar4 = local_138;
  _Var1._M_head_impl =
       (pQVar25->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
       _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  pQVar24 = *(QPDFObjectHandle **)
             &((_Var1._M_head_impl)->part6).
              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>;
  local_80 = *(pointer *)((long)&(_Var1._M_head_impl)->part6 + 8);
  if (pQVar24 == local_80) {
    uVar23 = 0xffffffffffffffff;
    uVar28 = 0xffffffffffffffff;
  }
  else {
    uVar21 = 0xffffffffffffffff;
    uVar20 = 0xffffffffffffffff;
    do {
      local_188 = (undefined1  [8])QPDFObjectHandle::getObjGen(pQVar24);
      _Var1._M_head_impl =
           (pQVar4->m)._M_t.
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      cVar15 = std::
               _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               ::find(&((_Var1._M_head_impl)->obj_cache)._M_t,(key_type *)local_188);
      if (cVar15._M_node == (_Base_ptr)((long)&(_Var1._M_head_impl)->obj_cache + 8U)) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_01,"linearization part6 object not in cache");
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pmVar16 = std::
                map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                ::operator[](&((pQVar4->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                              obj_cache,(key_type *)local_188);
      uVar23 = pmVar16->end_before_space;
      if (pmVar16->end_before_space < (long)uVar21) {
        uVar23 = uVar21;
      }
      uVar28 = pmVar16->end_after_space;
      if (pmVar16->end_after_space < (long)uVar20) {
        uVar28 = uVar20;
      }
      pQVar24 = pQVar24 + 1;
      uVar21 = uVar23;
      uVar20 = uVar28;
    } while (pQVar24 != local_80);
  }
  uVar21 = (local_a8->linp).first_page_end;
  if ((long)uVar21 <= (long)uVar28 && (long)uVar23 <= (long)uVar21) goto LAB_00215390;
  uVar20 = -uVar21;
  if (0 < (long)uVar21) {
    uVar20 = uVar21;
  }
  uVar27 = 1;
  if (9 < uVar20) {
    uVar19 = uVar20;
    uVar6 = 4;
    do {
      uVar27 = uVar6;
      if (uVar19 < 100) {
        uVar27 = uVar27 - 2;
        goto LAB_00214e65;
      }
      if (uVar19 < 1000) {
        uVar27 = uVar27 - 1;
        goto LAB_00214e65;
      }
      if (uVar19 < 10000) goto LAB_00214e65;
      bVar3 = 99999 < uVar19;
      uVar19 = uVar19 / 10000;
      uVar6 = uVar27 + 4;
    } while (bVar3);
    uVar27 = uVar27 + 1;
  }
LAB_00214e65:
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct((ulong)local_78,(char)uVar27 - (char)((long)uVar21 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_78[0] - ((long)uVar21 >> 0x3f)),uVar27,uVar20);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x28053d);
  local_110 = &local_100;
  puVar17 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar17) {
    local_100 = *puVar17;
    lStack_f8 = plVar10[3];
  }
  else {
    local_100 = *puVar17;
    local_110 = (ulong *)*plVar10;
  }
  local_108 = plVar10[1];
  *plVar10 = (long)puVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  pQVar11 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_110);
  QVar18 = (QPDFObjGen)(pQVar11 + 2);
  if (*pQVar11 == QVar18) {
    local_e0 = *(ulong *)QVar18;
    QStack_d8 = pQVar11[3];
    local_f0 = (QPDFObjGen)&local_e0;
  }
  else {
    local_e0 = *(ulong *)QVar18;
    local_f0 = *pQVar11;
  }
  local_e8 = pQVar11[1];
  *pQVar11 = QVar18;
  pQVar11[1].obj = 0;
  pQVar11[1].gen = 0;
  *(undefined1 *)&pQVar11[2].obj = 0;
  uVar21 = -uVar23;
  if (0 < (long)uVar23) {
    uVar21 = uVar23;
  }
  uVar27 = 1;
  if (9 < uVar21) {
    uVar20 = uVar21;
    uVar6 = 4;
    do {
      uVar27 = uVar6;
      if (uVar20 < 100) {
        uVar27 = uVar27 - 2;
        goto LAB_00214fd9;
      }
      if (uVar20 < 1000) {
        uVar27 = uVar27 - 1;
        goto LAB_00214fd9;
      }
      if (uVar20 < 10000) goto LAB_00214fd9;
      bVar3 = 99999 < uVar20;
      uVar20 = uVar20 / 10000;
      uVar6 = uVar27 + 4;
    } while (bVar3);
    uVar27 = uVar27 + 1;
  }
LAB_00214fd9:
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct((ulong)&local_c8,(char)uVar27 - (char)((long)uVar23 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_c8 - ((long)uVar23 >> 0x3f)),uVar27,uVar21);
  uVar23 = 0xf;
  if (local_f0 != (QPDFObjGen)&local_e0) {
    uVar23 = local_e0;
  }
  if (uVar23 < (ulong)(local_c0 + (long)local_e8)) {
    uVar23 = 0xf;
    if (local_c8 != local_b8) {
      uVar23 = local_b8[0];
    }
    if (uVar23 < (ulong)(local_c0 + (long)local_e8)) goto LAB_00215072;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_00215072:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_c8);
  }
  plVar10 = puVar12 + 2;
  if ((long *)*puVar12 == plVar10) {
    local_120 = *plVar10;
    uStack_118 = puVar12[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar10;
    local_130 = (long *)*puVar12;
  }
  local_128 = puVar12[1];
  *puVar12 = plVar10;
  puVar12[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_158 = &local_148;
  puVar17 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar17) {
    local_148 = *puVar17;
    lStack_140 = plVar10[3];
  }
  else {
    local_148 = *puVar17;
    local_158 = (ulong *)*plVar10;
  }
  local_150 = plVar10[1];
  *plVar10 = (long)puVar17;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  uVar23 = -uVar28;
  if (0 < (long)uVar28) {
    uVar23 = uVar28;
  }
  uVar27 = 1;
  if (9 < uVar23) {
    uVar21 = uVar23;
    uVar6 = 4;
    do {
      uVar27 = uVar6;
      if (uVar21 < 100) {
        uVar27 = uVar27 - 2;
        goto LAB_0021519f;
      }
      if (uVar21 < 1000) {
        uVar27 = uVar27 - 1;
        goto LAB_0021519f;
      }
      if (uVar21 < 10000) goto LAB_0021519f;
      bVar3 = 99999 < uVar21;
      uVar21 = uVar21 / 10000;
      uVar6 = uVar27 + 4;
    } while (bVar3);
    uVar27 = uVar27 + 1;
  }
LAB_0021519f:
  local_a0 = local_90;
  std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar27 - (char)((long)uVar28 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_a0 - ((long)uVar28 >> 0x3f)),uVar27,uVar23);
  uVar28 = 0xf;
  if (local_158 != &local_148) {
    uVar28 = local_148;
  }
  if (uVar28 < (ulong)(local_98 + local_150)) {
    uVar28 = 0xf;
    if (local_a0 != local_90) {
      uVar28 = local_90[0];
    }
    if (uVar28 < (ulong)(local_98 + local_150)) goto LAB_0021522b;
    pQVar11 = (QPDFObjGen *)
              std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_0021522b:
    pQVar11 = (QPDFObjGen *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_a0);
  }
  QVar18 = (QPDFObjGen)(pQVar11 + 2);
  if (*pQVar11 == QVar18) {
    local_180._8_8_ = *(undefined8 *)QVar18;
    local_180._16_8_ = pQVar11[3];
    local_188 = (undefined1  [8])((long)local_180 + 8);
  }
  else {
    local_180._8_8_ = *(undefined8 *)QVar18;
    local_188 = (undefined1  [8])*pQVar11;
  }
  local_180._0_8_ = pQVar11[1];
  *pQVar11 = QVar18;
  pQVar11[1].obj = 0;
  pQVar11[1].gen = 0;
  *(undefined1 *)QVar18 = 0;
  msg_04._M_str = (char *)local_188;
  msg_04._M_len._0_4_ = (int)local_180._0_8_;
  msg_04._M_len._4_4_ = SUB84(local_180._0_8_,4);
  linearizationWarning(local_138,msg_04);
  if (local_188 != (undefined1  [8])((long)local_180 + 8)) {
    operator_delete((void *)local_188,(ulong)(local_180._8_8_ + 1));
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if (local_f0 != (QPDFObjGen)&local_e0) {
    operator_delete((void *)local_f0,local_e0 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
LAB_00215390:
  pvVar5 = local_d0;
  pQVar25 = local_138;
  local_180._0_8_ = local_180._0_8_ & 0xffffffff00000000;
  local_180._8_8_ = (_Base_ptr)0x0;
  local_180._16_8_ = local_180;
  local_160 = 0;
  local_168 = (QPDFObjGen)local_180._16_8_;
  checkHSharedObject(local_138,local_d0,
                     (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     local_188);
  checkHPageOffset(pQVar25,pvVar5,
                   (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   local_188);
  checkHOutlines(pQVar25);
  bVar3 = ((pQVar25->m)._M_t.
           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linearization_warnings;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_188);
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool
QPDF::checkLinearizationInternal()
{
    // All comments referring to the PDF spec refer to the spec for version 1.4.

    // Check all values in linearization parameter dictionary

    LinParameters& p = m->linp;

    // L: file size in bytes -- checked by isLinearized

    // O: object number of first page
    std::vector<QPDFObjectHandle> const& pages = getAllPages();
    if (p.first_page_object != pages.at(0).getObjectID()) {
        QTC::TC("qpdf", "QPDF err /O mismatch");
        linearizationWarning("first page object (/O) mismatch");
    }

    // N: number of pages
    int npages = toI(pages.size());
    if (p.npages != npages) {
        // Not tested in the test suite
        linearizationWarning("page count (/N) mismatch");
    }

    for (size_t i = 0; i < toS(npages); ++i) {
        QPDFObjectHandle const& page = pages.at(i);
        QPDFObjGen og(page.getObjGen());
        if (m->xref_table[og].getType() == 2) {
            linearizationWarning(
                "page dictionary for page " + std::to_string(i) + " is compressed");
        }
    }

    // T: offset of whitespace character preceding xref entry for object 0
    m->file->seek(p.xref_zero_offset, SEEK_SET);
    while (true) {
        char ch;
        m->file->read(&ch, 1);
        if (!((ch == ' ') || (ch == '\r') || (ch == '\n'))) {
            m->file->seek(-1, SEEK_CUR);
            break;
        }
    }
    if (m->file->tell() != m->first_xref_item_offset) {
        QTC::TC("qpdf", "QPDF err /T mismatch");
        linearizationWarning(
            "space before first xref item (/T) mismatch (computed = " +
            std::to_string(m->first_xref_item_offset) +
            "; file = " + std::to_string(m->file->tell()));
    }

    // P: first page number -- Implementation note 124 says Acrobat ignores this value, so we will
    // too.

    // Check numbering of compressed objects in each xref section. For linearized files, all
    // compressed objects are supposed to be at the end of the containing xref section if any object
    // streams are in use.

    if (m->uncompressed_after_compressed) {
        linearizationWarning(
            "linearized file contains an uncompressed object after a compressed "
            "one in a cross-reference stream");
    }

    // Further checking requires optimization and order calculation. Don't allow optimization to
    // make changes.  If it has to, then the file is not properly linearized.  We use the xref table
    // to figure out which objects are compressed and which are uncompressed.
    { // local scope
        std::map<int, int> object_stream_data;
        for (auto const& iter: m->xref_table) {
            QPDFObjGen const& og = iter.first;
            QPDFXRefEntry const& entry = iter.second;
            if (entry.getType() == 2) {
                object_stream_data[og.getObj()] = entry.getObjStreamNumber();
            }
        }
        optimize_internal(object_stream_data, false, nullptr);
        calculateLinearizationData(object_stream_data);
    }

    // E: offset of end of first page -- Implementation note 123 says Acrobat includes on extra
    // object here by mistake.  pdlin fails to place thumbnail images in section 9, so when
    // thumbnails are present, it also gets the wrong value for /E.  It also doesn't count outlines
    // here when it should even though it places them in part 6.  This code fails to put thread
    // information dictionaries in part 9, so it actually gets the wrong value for E when threads
    // are present.  In that case, it would probably agree with pdlin.  As of this writing, the test
    // suite doesn't contain any files with threads.

    if (m->part6.empty()) {
        stopOnError("linearization part 6 unexpectedly empty");
    }
    qpdf_offset_t min_E = -1;
    qpdf_offset_t max_E = -1;
    for (auto const& oh: m->part6) {
        QPDFObjGen og(oh.getObjGen());
        if (m->obj_cache.count(og) == 0) {
            // All objects have to have been dereferenced to be classified.
            throw std::logic_error("linearization part6 object not in cache");
        }
        ObjCache const& oc = m->obj_cache[og];
        min_E = std::max(min_E, oc.end_before_space);
        max_E = std::max(max_E, oc.end_after_space);
    }
    if ((p.first_page_end < min_E) || (p.first_page_end > max_E)) {
        QTC::TC("qpdf", "QPDF warn /E mismatch");
        linearizationWarning(
            "end of first page section (/E) mismatch: /E = " + std::to_string(p.first_page_end) +
            "; computed = " + std::to_string(min_E) + ".." + std::to_string(max_E));
    }

    // Check hint tables

    std::map<int, int> shared_idx_to_obj;
    checkHSharedObject(pages, shared_idx_to_obj);
    checkHPageOffset(pages, shared_idx_to_obj);
    checkHOutlines();

    return !m->linearization_warnings;
}